

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void algorithm_suite::copy_empty(void)

{
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = 0;
  local_c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2c4,"void algorithm_suite::copy_empty()",&local_8,&local_c);
  return;
}

Assistant:

void copy_empty()
{
    std::vector<double> input = {};
    cumulative::moment<double> filter;
    std::copy(input.begin(), input.end(), push_inserter(filter));
    TRIAL_TEST_EQ(filter.size(), 0);
}